

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

uint32_t btorsim_bv_get_num_leading_zeros(BtorSimBitVector *bv)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar1 = bv->width;
  if (uVar1 == 0) {
    return 0;
  }
  uVar3 = 0;
  uVar2 = uVar1;
  do {
    uVar2 = uVar2 - 1;
    if (((&bv[1].width)[~(uVar2 >> 5) + bv->len] >> (uVar2 & 0x1f) & 1) != 0) {
      return uVar3;
    }
    uVar3 = uVar3 + 1;
  } while (uVar2 != 0);
  return uVar1;
}

Assistant:

uint32_t
btorsim_bv_get_num_leading_zeros (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i, res;

  for (i = bv->width - 1, res = 0; i < UINT_MAX; i--)
  {
    if (btorsim_bv_get_bit (bv, i)) break;
    res += 1;
  }

  return res;
}